

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O0

void __thiscall MidiInAlsa::openVirtualPort(MidiInAlsa *this,string *portName)

{
  pthread_t pVar1;
  pthread_t __thread2;
  undefined8 uVar2;
  string *psVar3;
  undefined1 *puVar4;
  undefined4 uVar5;
  int iVar6;
  long lVar7;
  size_t __n;
  undefined8 uVar8;
  MidiApi *pMVar9;
  undefined1 *puVar10;
  string *psVar11;
  snd_seq_port_info_t *__newthread;
  undefined8 uStack_100;
  undefined1 auStack_f8 [8];
  string *local_f0;
  string *local_e8;
  string *local_e0;
  string *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  MidiApi *local_c0;
  string local_b8;
  int local_94;
  undefined1 local_90 [4];
  int err;
  pthread_attr_t attr;
  string local_48;
  undefined1 *local_28;
  snd_seq_port_info_t *pinfo;
  AlsaMidiData *data;
  string *portName_local;
  MidiInAlsa *this_local;
  
  puVar10 = auStack_f8;
  pinfo = (snd_seq_port_info_t *)(this->super_MidiInApi).super_MidiApi.apiData_;
  local_c0 = (MidiApi *)this;
  data = (AlsaMidiData *)portName;
  portName_local = (string *)this;
  if (*(int *)(pinfo + 0xc) < 0) {
    uStack_100 = 0x11836b;
    lVar7 = snd_seq_port_info_sizeof();
    lVar7 = -(lVar7 + 0xfU & 0xfffffffffffffff0);
    puVar10 = auStack_f8 + lVar7;
    local_c8 = puVar10;
    local_28 = puVar10;
    *(undefined8 *)(auStack_f8 + lVar7 + -8) = 0x118393;
    __n = snd_seq_port_info_sizeof();
    puVar4 = local_c8;
    *(undefined8 *)(auStack_f8 + lVar7 + -8) = 0x1183a4;
    memset(puVar4,0,__n);
    puVar4 = local_28;
    *(undefined8 *)(auStack_f8 + lVar7 + -8) = 0x1183b2;
    snd_seq_port_info_set_capability(puVar4,0x42);
    puVar4 = local_28;
    *(undefined8 *)(auStack_f8 + lVar7 + -8) = 0x1183c0;
    snd_seq_port_info_set_type(puVar4,0x100002);
    puVar4 = local_28;
    *(undefined8 *)(auStack_f8 + lVar7 + -8) = 0x1183ce;
    snd_seq_port_info_set_midi_channels(puVar4,0x10);
    puVar4 = local_28;
    *(undefined8 *)(auStack_f8 + lVar7 + -8) = 0x1183dc;
    snd_seq_port_info_set_timestamping(puVar4,1);
    puVar4 = local_28;
    *(undefined8 *)(auStack_f8 + lVar7 + -8) = 0x1183ea;
    snd_seq_port_info_set_timestamp_real(puVar4,1);
    puVar4 = local_28;
    uVar5 = *(undefined4 *)(pinfo + 0x48);
    *(undefined8 *)(auStack_f8 + lVar7 + -8) = 0x1183fa;
    snd_seq_port_info_set_timestamp_queue(puVar4,uVar5);
    local_d0 = local_28;
    *(undefined8 *)(auStack_f8 + lVar7 + -8) = 0x11840e;
    uVar8 = std::__cxx11::string::c_str();
    puVar4 = local_d0;
    *(undefined8 *)(auStack_f8 + lVar7 + -8) = 0x11841d;
    snd_seq_port_info_set_name(puVar4,uVar8);
    puVar4 = local_28;
    uVar8 = *(undefined8 *)pinfo;
    *(undefined8 *)(auStack_f8 + lVar7 + -8) = 0x11842d;
    uVar5 = snd_seq_create_port(uVar8,puVar4);
    puVar4 = local_28;
    *(undefined4 *)(pinfo + 0xc) = uVar5;
    if (*(int *)(pinfo + 0xc) < 0) {
      psVar11 = &local_c0->errorString_;
      local_e0 = (string *)psVar11;
      *(undefined8 *)(auStack_f8 + lVar7 + -8) = 0x11845e;
      std::__cxx11::string::operator=
                ((string *)psVar11,"MidiInAlsa::openVirtualPort: ALSA error creating virtual port.")
      ;
      psVar3 = local_e0;
      local_d8 = &local_48;
      *(undefined8 *)(auStack_f8 + lVar7 + -8) = 0x118475;
      std::__cxx11::string::string((string *)&local_48,psVar3);
      pMVar9 = local_c0;
      psVar11 = local_d8;
      *(undefined8 *)(auStack_f8 + lVar7 + -8) = 0x11848d;
      MidiApi::error(pMVar9,DRIVER_ERROR,psVar11);
      *(undefined8 *)(auStack_f8 + lVar7 + -8) = 0x118498;
      std::__cxx11::string::~string((string *)&local_48);
      return;
    }
    *(undefined8 *)(auStack_f8 + lVar7 + -8) = 0x1184c0;
    uVar5 = snd_seq_port_info_get_port(puVar4);
    *(undefined4 *)(pinfo + 0xc) = uVar5;
  }
  if (((ulong)local_c0[1].errorCallback_ & 0x100) == 0) {
    pVar1 = *(pthread_t *)(pinfo + 0x30);
    __thread2 = *(pthread_t *)(pinfo + 0x38);
    *(undefined8 *)(puVar10 + -8) = 0x1184f9;
    iVar6 = pthread_equal(pVar1,__thread2);
    if (iVar6 == 0) {
      pVar1 = *(pthread_t *)(pinfo + 0x30);
      *(undefined8 *)(puVar10 + -8) = 0x11850f;
      pthread_join(pVar1,(void **)0x0);
    }
    uVar8 = *(undefined8 *)pinfo;
    uVar5 = *(undefined4 *)(pinfo + 0x48);
    *(undefined8 *)(puVar10 + -8) = 0x11852e;
    snd_seq_control_queue(uVar8,uVar5,0x1e,0,0);
    uVar8 = *(undefined8 *)pinfo;
    *(undefined8 *)(puVar10 + -8) = 0x11853a;
    snd_seq_drain_output(uVar8);
    *(undefined8 *)(puVar10 + -8) = 0x118546;
    pthread_attr_init((pthread_attr_t *)local_90);
    *(undefined8 *)(puVar10 + -8) = 0x118554;
    pthread_attr_setdetachstate((pthread_attr_t *)local_90,0);
    *(undefined8 *)(puVar10 + -8) = 0x118562;
    pthread_attr_setschedpolicy((pthread_attr_t *)local_90,0);
    *(bool *)((long)&local_c0[1].errorCallback_ + 1) = true;
    __newthread = pinfo + 0x30;
    pMVar9 = local_c0 + 1;
    *(undefined8 *)(puVar10 + -8) = 0x11858f;
    local_94 = pthread_create((pthread_t *)__newthread,(pthread_attr_t *)local_90,alsaMidiHandler,
                              pMVar9);
    *(undefined8 *)(puVar10 + -8) = 0x1185a1;
    pthread_attr_destroy((pthread_attr_t *)local_90);
    if (local_94 != 0) {
      if (*(long *)(pinfo + 0x10) != 0) {
        uVar8 = *(undefined8 *)pinfo;
        uVar2 = *(undefined8 *)(pinfo + 0x10);
        *(undefined8 *)(puVar10 + -8) = 0x1185cd;
        snd_seq_unsubscribe_port(uVar8,uVar2);
        uVar8 = *(undefined8 *)(pinfo + 0x10);
        *(undefined8 *)(puVar10 + -8) = 0x1185da;
        snd_seq_port_subscribe_free(uVar8);
        *(undefined8 *)(pinfo + 0x10) = 0;
      }
      *(bool *)((long)&local_c0[1].errorCallback_ + 1) = false;
      psVar11 = &local_c0->errorString_;
      local_f0 = (string *)psVar11;
      *(undefined8 *)(puVar10 + -8) = 0x11860b;
      std::__cxx11::string::operator=
                ((string *)psVar11,"MidiInAlsa::openPort: error starting MIDI input thread!");
      psVar3 = local_f0;
      local_e8 = &local_b8;
      *(undefined8 *)(puVar10 + -8) = 0x118625;
      std::__cxx11::string::string((string *)&local_b8,psVar3);
      pMVar9 = local_c0;
      psVar11 = local_e8;
      *(undefined8 *)(puVar10 + -8) = 0x11863d;
      MidiApi::error(pMVar9,THREAD_ERROR,psVar11);
      *(undefined8 *)(puVar10 + -8) = 0x11864b;
      std::__cxx11::string::~string((string *)&local_b8);
    }
  }
  return;
}

Assistant:

void MidiInAlsa :: openVirtualPort( const std::string &portName )
{
  AlsaMidiData *data = static_cast<AlsaMidiData *> (apiData_);
  if ( data->vport < 0 ) {
    snd_seq_port_info_t *pinfo;
    snd_seq_port_info_alloca( &pinfo );
    snd_seq_port_info_set_capability( pinfo,
                                      SND_SEQ_PORT_CAP_WRITE |
                                      SND_SEQ_PORT_CAP_SUBS_WRITE );
    snd_seq_port_info_set_type( pinfo,
                                SND_SEQ_PORT_TYPE_MIDI_GENERIC |
                                SND_SEQ_PORT_TYPE_APPLICATION );
    snd_seq_port_info_set_midi_channels( pinfo, 16 );
#ifndef AVOID_TIMESTAMPING
    snd_seq_port_info_set_timestamping( pinfo, 1 );
    snd_seq_port_info_set_timestamp_real( pinfo, 1 );
    snd_seq_port_info_set_timestamp_queue( pinfo, data->queue_id );
#endif
    snd_seq_port_info_set_name( pinfo, portName.c_str() );
    data->vport = snd_seq_create_port( data->seq, pinfo );

    if ( data->vport < 0 ) {
      errorString_ = "MidiInAlsa::openVirtualPort: ALSA error creating virtual port.";
      error( RtMidiError::DRIVER_ERROR, errorString_ );
      return;
    }
    data->vport = snd_seq_port_info_get_port( pinfo );
  }

  if ( inputData_.doInput == false ) {
    // Wait for old thread to stop, if still running
    if ( !pthread_equal( data->thread, data->dummy_thread_id ) )
      pthread_join( data->thread, NULL );

    // Start the input queue
#ifndef AVOID_TIMESTAMPING
    snd_seq_start_queue( data->seq, data->queue_id, NULL );
    snd_seq_drain_output( data->seq );
#endif
    // Start our MIDI input thread.
    pthread_attr_t attr;
    pthread_attr_init( &attr );
    pthread_attr_setdetachstate( &attr, PTHREAD_CREATE_JOINABLE );
    pthread_attr_setschedpolicy( &attr, SCHED_OTHER );

    inputData_.doInput = true;
    int err = pthread_create( &data->thread, &attr, alsaMidiHandler, &inputData_ );
    pthread_attr_destroy( &attr );
    if ( err ) {
      if ( data->subscription ) {
        snd_seq_unsubscribe_port( data->seq, data->subscription );
        snd_seq_port_subscribe_free( data->subscription );
        data->subscription = 0;
      }
      inputData_.doInput = false;
      errorString_ = "MidiInAlsa::openPort: error starting MIDI input thread!";
      error( RtMidiError::THREAD_ERROR, errorString_ );
      return;
    }
  }
}